

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec,xmlChar *value,void *data,int compound)

{
  xmlRegStateType xVar1;
  xmlRegexpPtr comp;
  xmlRegAtomPtr pxVar2;
  xmlRegCounter *pxVar3;
  xmlRegStatePtr pxVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  xmlChar *pxVar11;
  xmlRegStatePtr pxVar12;
  xmlRegInputTokenPtr pxVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  xmlRegTrans *pxVar18;
  long lVar19;
  xmlRegTrans *pxVar20;
  xmlChar *str1;
  uint uVar21;
  long lVar22;
  
  iVar7 = -1;
  if (((exec == (xmlRegExecCtxtPtr)0x0) || (comp = exec->comp, comp == (xmlRegexpPtr)0x0)) ||
     (iVar7 = exec->status, iVar7 != 0)) {
    return iVar7;
  }
  if (comp->compact != (int *)0x0) {
    iVar7 = xmlRegCompactPushString(exec,comp,value,data);
    return iVar7;
  }
  if (value == (xmlChar *)0x0) {
    if (exec->state->type == XML_REGEXP_FINAL_STATE) {
      return 1;
    }
    str1 = (xmlChar *)0x0;
  }
  else {
    str1 = value;
    if (0 < exec->inputStackNr) {
      xmlFARegExecSaveInputString(exec,value,data);
      data = exec->inputStack[exec->index].data;
      str1 = exec->inputStack[exec->index].value;
    }
  }
  bVar5 = true;
LAB_0019fb02:
  if (exec->status != 0) {
    return exec->status;
  }
  if (str1 != (xmlChar *)0x0) goto LAB_0019fb37;
  xVar1 = exec->state->type;
  if ((value != (xmlChar *)0x0) || (xVar1 == XML_REGEXP_FINAL_STATE)) {
    return (uint)(xVar1 == XML_REGEXP_FINAL_STATE);
  }
  if (exec->counts != (int *)0x0) goto LAB_0019fb37;
  str1 = (xmlChar *)0x0;
  goto LAB_001a00a0;
LAB_0019fb37:
  exec->transcount = 0;
  uVar21 = exec->transno;
  while( true ) {
    uVar16 = 1;
    pxVar12 = exec->state;
    uVar10 = pxVar12->nbTrans;
    if ((int)uVar10 <= (int)uVar21) break;
    pxVar20 = pxVar12->trans;
    iVar7 = pxVar20[(int)uVar21].to;
    if (-1 < (long)iVar7) {
      pxVar18 = pxVar20 + (int)uVar21;
      pxVar2 = pxVar18->atom;
      uVar14 = pxVar18->count;
      uVar15 = (ulong)uVar14;
      if (uVar15 == 0x123457) {
        if (value == (xmlChar *)0x0 && str1 == (xmlChar *)0x0) {
          str1 = (xmlChar *)0x0;
LAB_0019fee4:
          bVar6 = true;
          if (((exec->callback != (xmlRegExecCallbacks)0x0) && (pxVar2 != (xmlRegAtomPtr)0x0)) &&
             (data != (void *)0x0)) {
            (*exec->callback)((xmlRegExecCtxtPtr)exec->data,(xmlChar *)pxVar2->valuep,pxVar2->data,
                              data);
          }
          if (exec->transno + 1 < exec->state->nbTrans) {
            if (exec->inputStackNr < 1) {
              xmlFARegExecSaveInputString(exec,str1,data);
            }
            xmlFARegExecSave(exec);
          }
          if (-1 < (long)pxVar18->counter) {
            exec->counts[pxVar18->counter] = exec->counts[pxVar18->counter] + 1;
          }
          if ((ulong)(uint)pxVar18->count < 0x123456) {
            exec->counts[(uint)pxVar18->count] = 0;
          }
          pxVar12 = exec->comp->states[pxVar18->to];
          if (pxVar12 == (xmlRegStatePtr)0x0) {
            pxVar12 = (xmlRegStatePtr)0x0;
          }
          else if (pxVar12->type == XML_REGEXP_SINK_STATE) {
            if (exec->errString != (xmlChar *)0x0) {
              (*xmlFree)(exec->errString);
            }
            pxVar11 = xmlStrdup(str1);
            exec->errString = pxVar11;
            exec->errState = exec->state;
            memcpy(exec->errCounts,exec->counts,(long)exec->comp->nbCounters << 2);
            pxVar12 = exec->comp->states[pxVar18->to];
          }
          exec->state = pxVar12;
          exec->transno = 0;
          bVar5 = bVar6;
          if (pxVar18->atom == (xmlRegAtomPtr)0x0) goto LAB_0019fb02;
          pxVar13 = exec->inputStack;
          data = (void *)0x0;
          str1 = (xmlChar *)0x0;
          if (pxVar13 == (xmlRegInputTokenPtr)0x0) goto LAB_0019fb02;
          iVar7 = exec->index + 1;
          exec->index = iVar7;
          bVar5 = true;
          data = (void *)0x0;
          str1 = (xmlChar *)0x0;
          if (exec->inputStackNr <= iVar7) goto LAB_0019fb02;
          goto LAB_001a0040;
        }
        if (str1 == (xmlChar *)0x0) {
LAB_0019fe86:
          str1 = (xmlChar *)0x0;
        }
        else {
          lVar22 = 0;
          for (lVar17 = 0; lVar17 < (int)uVar10; lVar17 = lVar17 + 1) {
            lVar19 = (long)*(int *)((long)&pxVar12->trans->counter + lVar22);
            if ((-1 < lVar19) &&
               (pxVar20 = (xmlRegTrans *)((long)&pxVar12->trans->atom + lVar22), pxVar20 != pxVar18)
               ) {
              pxVar3 = exec->comp->counters;
              iVar7 = exec->counts[lVar19];
              if ((iVar7 < pxVar3[lVar19].max) &&
                 ((pxVar20->atom != (xmlRegAtomPtr)0x0 &&
                  (iVar8 = xmlStrEqual(str1,(xmlChar *)pxVar20->atom->valuep), iVar8 != 0)))) break;
              if ((pxVar3[lVar19].min <= iVar7) &&
                 (((iVar7 < pxVar3[lVar19].max && (pxVar20->atom != (xmlRegAtomPtr)0x0)) &&
                  (iVar7 = xmlStrEqual(str1,(xmlChar *)pxVar20->atom->valuep), iVar7 != 0))))
              goto LAB_0019fee4;
            }
            pxVar12 = exec->state;
            uVar10 = pxVar12->nbTrans;
            lVar22 = lVar22 + 0x18;
          }
        }
      }
      else {
        if (uVar14 == 0x123456) {
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          lVar17 = 0;
          do {
            if ((ulong)uVar10 * 0x18 - lVar17 == 0) goto LAB_0019fee4;
            if (((ulong)uVar21 * 0x18 - lVar17 != 0) &&
               (uVar16 = *(uint *)((long)&pxVar20->counter + lVar17), -1 < (int)uVar16)) {
              pxVar3 = exec->comp->counters;
              if ((exec->counts[uVar16] < pxVar3[uVar16].min) ||
                 (pxVar3[uVar16].max < exec->counts[uVar16])) goto LAB_0019febd;
            }
            lVar17 = lVar17 + 0x18;
          } while( true );
        }
        if ((int)uVar14 < 0) {
          if (pxVar2 == (xmlRegAtomPtr)0x0) {
            fwrite("epsilon transition left at runtime\n",0x23,1,_stderr);
            exec->status = -2;
            uVar21 = exec->transno;
            break;
          }
          if (str1 == (xmlChar *)0x0) goto LAB_0019fe86;
          uVar9 = xmlRegStrEqualWildcard((xmlChar *)pxVar2->valuep,str1);
          uVar14 = uVar9 ^ 1;
          if (compound == 0) {
            uVar14 = 0;
          }
          if (pxVar2->neg == 0) {
            uVar14 = uVar9;
          }
          if ((uVar14 != 0) &&
             ((lVar17 = (long)pxVar18->counter, lVar17 < 0 ||
              (exec->counts[lVar17] < exec->comp->counters[lVar17].max)))) {
            if ((pxVar2->min < 1) || (pxVar2->max < 1)) goto LAB_0019fee4;
            pxVar12 = exec->comp->states[iVar7];
            if ((int)(uVar21 + 1) < (int)uVar10) {
              if (exec->inputStackNr < 1) {
                xmlFARegExecSaveInputString(exec,str1,data);
              }
              xmlFARegExecSave(exec);
            }
            exec->transcount = 1;
            uVar21 = uVar16;
            do {
              uVar10 = uVar16;
              if (uVar21 == pxVar2->max) break;
              iVar7 = exec->index;
              lVar17 = (long)iVar7 + 1;
              exec->index = (int)lVar17;
              str1 = exec->inputStack[lVar17].value;
              data = exec->inputStack[lVar17].data;
              if (str1 == (xmlChar *)0x0) {
                exec->index = iVar7;
                str1 = (xmlChar *)0x0;
                break;
              }
              if (pxVar2->min <= (int)uVar21) {
                iVar7 = exec->transno;
                pxVar4 = exec->state;
                exec->transno = -1;
                exec->state = pxVar12;
                if (exec->inputStackNr < 1) {
                  xmlFARegExecSaveInputString(exec,str1,data);
                }
                xmlFARegExecSave(exec);
                exec->transno = iVar7;
                exec->state = pxVar4;
              }
              uVar10 = xmlStrEqual(str1,(xmlChar *)pxVar2->valuep);
              uVar21 = exec->transcount + 1;
              exec->transcount = uVar21;
            } while (uVar10 == 1);
            if ((pxVar2->min <= (int)uVar21) && (0 < (int)uVar10)) goto LAB_0019feb8;
            goto LAB_001a00a0;
          }
        }
        else {
          pxVar3 = exec->comp->counters;
          if (pxVar3[uVar15].min <= exec->counts[uVar15]) {
            uVar10 = (uint)(exec->counts[uVar15] <= pxVar3[uVar15].max);
LAB_0019feb8:
            if (uVar10 == 1) goto LAB_0019fee4;
          }
        }
      }
    }
LAB_0019febd:
    uVar21 = exec->transno + 1;
    exec->transno = uVar21;
  }
  if ((uVar21 == 0) && (exec->state->nbTrans != 0)) goto LAB_0019fb02;
LAB_001a00a0:
  if (bVar5) {
    bVar5 = true;
    if ((exec->state == (xmlRegStatePtr)0x0) || (exec->state->type == XML_REGEXP_SINK_STATE))
    goto LAB_001a0112;
    if (exec->errString != (xmlChar *)0x0) {
      (*xmlFree)(exec->errString);
    }
    pxVar11 = xmlStrdup(str1);
    exec->errString = pxVar11;
    exec->errState = exec->state;
    lVar17 = (long)exec->comp->nbCounters;
    if (lVar17 != 0) {
      memcpy(exec->errCounts,exec->counts,lVar17 << 2);
    }
  }
  bVar5 = false;
LAB_001a0112:
  exec->determinist = 0;
  xmlFARegExecRollBack(exec);
  pxVar13 = exec->inputStack;
  if ((pxVar13 != (xmlRegInputTokenPtr)0x0) && (exec->status == 0)) {
    iVar7 = exec->index;
    bVar6 = bVar5;
LAB_001a0040:
    bVar5 = bVar6;
    str1 = pxVar13[iVar7].value;
    data = pxVar13[iVar7].data;
  }
  goto LAB_0019fb02;
}

Assistant:

static int
xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                     void *data, int compound) {
    xmlRegTransPtr trans;
    xmlRegAtomPtr atom;
    int ret;
    int final = 0;
    int progress = 1;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != 0)
	return(exec->status);

    if (exec->comp->compact != NULL)
	return(xmlRegCompactPushString(exec, exec->comp, value, data));

    if (value == NULL) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE)
	    return(1);
	final = 1;
    }

#ifdef DEBUG_PUSH
    printf("value pushed: %s\n", value);
#endif
    /*
     * If we have an active rollback stack push the new value there
     * and get back to where we were left
     */
    if ((value != NULL) && (exec->inputStackNr > 0)) {
	xmlFARegExecSaveInputString(exec, value, data);
	value = exec->inputStack[exec->index].value;
	data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
	printf("value loaded: %s\n", value);
#endif
    }

    while ((exec->status == 0) &&
	   ((value != NULL) ||
	    ((final == 1) &&
	     (exec->state->type != XML_REGEXP_FINAL_STATE)))) {

	/*
	 * End of input on non-terminal state, rollback, however we may
	 * still have epsilon like transition for counted transitions
	 * on counters, in that case don't break too early.
	 */
	if ((value == NULL) && (exec->counts == NULL))
	    goto rollback;

	exec->transcount = 0;
	for (;exec->transno < exec->state->nbTrans;exec->transno++) {
	    trans = &exec->state->trans[exec->transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    ret = 0;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 0;

#ifdef DEBUG_PUSH
		printf("testing all lax %d\n", trans->count);
#endif
		/*
		 * Check all counted transitions from the current state
		 */
		if ((value == NULL) && (final)) {
		    ret = 1;
		} else if (value != NULL) {
		    for (i = 0;i < exec->state->nbTrans;i++) {
			t = &exec->state->trans[i];
			if ((t->counter < 0) || (t == trans))
			    continue;
			counter = &exec->comp->counters[t->counter];
			count = exec->counts[t->counter];
			if ((count < counter->max) &&
		            (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 0;
			    break;
			}
			if ((count >= counter->min) &&
			    (count < counter->max) &&
			    (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 1;
			    break;
			}
		    }
		}
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 1;

#ifdef DEBUG_PUSH
		printf("testing all %d\n", trans->count);
#endif
		/*
		 * Check all counted transitions from the current state
		 */
		for (i = 0;i < exec->state->nbTrans;i++) {
                    t = &exec->state->trans[i];
		    if ((t->counter < 0) || (t == trans))
			continue;
                    counter = &exec->comp->counters[t->counter];
		    count = exec->counts[t->counter];
		    if ((count < counter->min) || (count > counter->max)) {
			ret = 0;
			break;
		    }
		}
	    } else if (trans->count >= 0) {
		int count;
		xmlRegCounterPtr counter;

		/*
		 * A counted transition.
		 */

		count = exec->counts[trans->count];
		counter = &exec->comp->counters[trans->count];
#ifdef DEBUG_PUSH
		printf("testing count %d: val %d, min %d, max %d\n",
		       trans->count, count, counter->min,  counter->max);
#endif
		ret = ((count >= counter->min) && (count <= counter->max));
	    } else if (atom == NULL) {
		fprintf(stderr, "epsilon transition left at runtime\n");
		exec->status = -2;
		break;
	    } else if (value != NULL) {
		ret = xmlRegStrEqualWildcard(atom->valuep, value);
		if (atom->neg) {
		    ret = !ret;
		    if (!compound)
		        ret = 0;
		}
		if ((ret == 1) && (trans->counter >= 0)) {
		    xmlRegCounterPtr counter;
		    int count;

		    count = exec->counts[trans->counter];
		    counter = &exec->comp->counters[trans->counter];
		    if (count >= counter->max)
			ret = 0;
		}

		if ((ret == 1) && (atom->min > 0) && (atom->max > 0)) {
		    xmlRegStatePtr to = exec->comp->states[trans->to];

		    /*
		     * this is a multiple input sequence
		     */
		    if (exec->state->nbTrans > exec->transno + 1) {
			if (exec->inputStackNr <= 0) {
			    xmlFARegExecSaveInputString(exec, value, data);
			}
			xmlFARegExecSave(exec);
		    }
		    exec->transcount = 1;
		    do {
			/*
			 * Try to progress as much as possible on the input
			 */
			if (exec->transcount == atom->max) {
			    break;
			}
			exec->index++;
			value = exec->inputStack[exec->index].value;
			data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
			printf("value loaded: %s\n", value);
#endif

			/*
			 * End of input: stop here
			 */
			if (value == NULL) {
			    exec->index --;
			    break;
			}
			if (exec->transcount >= atom->min) {
			    int transno = exec->transno;
			    xmlRegStatePtr state = exec->state;

			    /*
			     * The transition is acceptable save it
			     */
			    exec->transno = -1; /* trick */
			    exec->state = to;
			    if (exec->inputStackNr <= 0) {
				xmlFARegExecSaveInputString(exec, value, data);
			    }
			    xmlFARegExecSave(exec);
			    exec->transno = transno;
			    exec->state = state;
			}
			ret = xmlStrEqual(value, atom->valuep);
			exec->transcount++;
		    } while (ret == 1);
		    if (exec->transcount < atom->min)
			ret = 0;

		    /*
		     * If the last check failed but one transition was found
		     * possible, rollback
		     */
		    if (ret < 0)
			ret = 0;
		    if (ret == 0) {
			goto rollback;
		    }
		}
	    }
	    if (ret == 1) {
		if ((exec->callback != NULL) && (atom != NULL) &&
			(data != NULL)) {
		    exec->callback(exec->data, atom->valuep,
			           atom->data, data);
		}
		if (exec->state->nbTrans > exec->transno + 1) {
		    if (exec->inputStackNr <= 0) {
			xmlFARegExecSaveInputString(exec, value, data);
		    }
		    xmlFARegExecSave(exec);
		}
		if (trans->counter >= 0) {
#ifdef DEBUG_PUSH
		    printf("Increasing count %d\n", trans->counter);
#endif
		    exec->counts[trans->counter]++;
		}
		if ((trans->count >= 0) &&
		    (trans->count < REGEXP_ALL_COUNTER)) {
#ifdef DEBUG_REGEXP_EXEC
		    printf("resetting count %d on transition\n",
		           trans->count);
#endif
		    exec->counts[trans->count] = 0;
		}
#ifdef DEBUG_PUSH
		printf("entering state %d\n", trans->to);
#endif
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    /*
		     * entering a sink state, save the current state as error
		     * state.
		     */
		    if (exec->errString != NULL)
			xmlFree(exec->errString);
		    exec->errString = xmlStrdup(value);
		    exec->errState = exec->state;
		    memcpy(exec->errCounts, exec->counts,
			   exec->comp->nbCounters * sizeof(int));
		}
		exec->state = exec->comp->states[trans->to];
		exec->transno = 0;
		if (trans->atom != NULL) {
		    if (exec->inputStack != NULL) {
			exec->index++;
			if (exec->index < exec->inputStackNr) {
			    value = exec->inputStack[exec->index].value;
			    data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
			    printf("value loaded: %s\n", value);
#endif
			} else {
			    value = NULL;
			    data = NULL;
#ifdef DEBUG_PUSH
			    printf("end of input\n");
#endif
			}
		    } else {
			value = NULL;
			data = NULL;
#ifdef DEBUG_PUSH
			printf("end of input\n");
#endif
		    }
		}
		goto progress;
	    } else if (ret < 0) {
		exec->status = -4;
		break;
	    }
	}
	if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
rollback:
            /*
	     * if we didn't yet rollback on the current input
	     * store the current state as the error state.
	     */
	    if ((progress) && (exec->state != NULL) &&
	        (exec->state->type != XML_REGEXP_SINK_STATE)) {
	        progress = 0;
		if (exec->errString != NULL)
		    xmlFree(exec->errString);
		exec->errString = xmlStrdup(value);
		exec->errState = exec->state;
                if (exec->comp->nbCounters)
                    memcpy(exec->errCounts, exec->counts,
                           exec->comp->nbCounters * sizeof(int));
	    }

	    /*
	     * Failed to find a way out
	     */
	    exec->determinist = 0;
	    xmlFARegExecRollBack(exec);
	    if ((exec->inputStack != NULL ) && (exec->status == 0)) {
		value = exec->inputStack[exec->index].value;
		data = exec->inputStack[exec->index].data;
#ifdef DEBUG_PUSH
		printf("value loaded: %s\n", value);
#endif
	    }
	}
	continue;
progress:
        progress = 1;
	continue;
    }
    if (exec->status == 0) {
        return(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
#ifdef DEBUG_ERR
    if (exec->status < 0) {
	testerr(exec);
    }
#endif
    return(exec->status);
}